

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::SetColumnOffset(int column_index,float offset)

{
  ImVector<ImGuiOldColumnData> *this;
  float fVar1;
  float fVar2;
  bool bVar3;
  ImGuiOldColumns *pIVar4;
  undefined1 auVar5 [16];
  ImGuiContext *pIVar6;
  uint uVar7;
  ImGuiOldColumnData *pIVar8;
  int i;
  undefined1 auVar9 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  float local_50;
  
  auVar10._4_60_ = in_register_00001204;
  auVar10._0_4_ = offset;
  while( true ) {
    pIVar6 = GImGui;
    pIVar4 = (GImGui->CurrentWindow->DC).CurrentColumns;
    if (pIVar4 == (ImGuiOldColumns *)0x0) {
      __assert_fail("columns != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                    ,0xe32,"void ImGui::SetColumnOffset(int, float)");
    }
    if (column_index < 0) {
      column_index = pIVar4->Current;
    }
    if ((pIVar4->Columns).Size <= column_index) break;
    this = &pIVar4->Columns;
    uVar7 = pIVar4->Flags;
    auVar11 = ZEXT816(0) << 0x40;
    if (((uVar7 & 4) == 0) && (column_index < pIVar4->Count + -1)) {
      i = column_index;
      if (column_index < 0) {
        i = pIVar4->Current;
      }
      bVar3 = pIVar4->IsBeingResized;
      pIVar8 = ImVector<ImGuiOldColumnData>::operator[](this,i + 1);
      if (bVar3 == false) {
        local_50 = pIVar8->OffsetNorm;
        pIVar8 = ImVector<ImGuiOldColumnData>::operator[](this,i);
      }
      else {
        local_50 = pIVar8->OffsetNormBeforeResize;
        pIVar8 = ImVector<ImGuiOldColumnData>::operator[](this,i);
        pIVar8 = (ImGuiOldColumnData *)&pIVar8->OffsetNormBeforeResize;
      }
      auVar11 = ZEXT416((uint)((local_50 - pIVar8->OffsetNorm) * (pIVar4->OffMaxX - pIVar4->OffMinX)
                              ));
      uVar7 = pIVar4->Flags;
      bVar3 = true;
      auVar10 = ZEXT464(auVar10._0_4_);
    }
    else {
      bVar3 = false;
    }
    fVar1 = pIVar4->OffMaxX;
    if ((uVar7 & 8) == 0) {
      auVar5 = vminss_avx(auVar10._0_16_,
                          ZEXT416((uint)(fVar1 - (float)(pIVar4->Count - column_index) *
                                                 (pIVar6->Style).ColumnsMinSpacing)));
      auVar10 = ZEXT1664(auVar5);
    }
    fVar2 = pIVar4->OffMinX;
    pIVar8 = ImVector<ImGuiOldColumnData>::operator[](this,column_index);
    pIVar8->OffsetNorm = (auVar10._0_4_ - fVar2) / (fVar1 - fVar2);
    if (!bVar3) {
      return;
    }
    column_index = column_index + 1;
    auVar9 = ZEXT416((uint)(pIVar6->Style).ColumnsMinSpacing);
    auVar5 = vcmpss_avx(auVar11,auVar9,2);
    auVar11 = vblendvps_avx(auVar11,auVar9,auVar5);
    auVar10 = ZEXT464((uint)(auVar10._0_4_ + auVar11._0_4_));
  }
  __assert_fail("column_index < columns->Columns.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                ,0xe36,"void ImGui::SetColumnOffset(int, float)");
}

Assistant:

void ImGui::SetColumnOffset(int column_index, float offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    if (column_index < 0)
        column_index = columns->Current;
    IM_ASSERT(column_index < columns->Columns.Size);

    const bool preserve_width = !(columns->Flags & ImGuiOldColumnFlags_NoPreserveWidths) && (column_index < columns->Count - 1);
    const float width = preserve_width ? GetColumnWidthEx(columns, column_index, columns->IsBeingResized) : 0.0f;

    if (!(columns->Flags & ImGuiOldColumnFlags_NoForceWithinWindow))
        offset = ImMin(offset, columns->OffMaxX - g.Style.ColumnsMinSpacing * (columns->Count - column_index));
    columns->Columns[column_index].OffsetNorm = GetColumnNormFromOffset(columns, offset - columns->OffMinX);

    if (preserve_width)
        SetColumnOffset(column_index + 1, offset + ImMax(g.Style.ColumnsMinSpacing, width));
}